

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O0

void __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::Alex
          (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *this)

{
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *this_00;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *in_RDI;
  undefined1 unaff_retaddr;
  LinearModel<int> *in_stack_00000008;
  int in_stack_00000014;
  V *in_stack_00000018;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
  *in_stack_00000020;
  data_node_type *empty_data_node;
  Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
  *in_stack_ffffffffffffffb8;
  InternalStats *in_stack_ffffffffffffffc0;
  AlexCompare *comp;
  
  (in_RDI->super_AlexNode<int,_int>)._vptr_AlexNode = (_func_int **)0x0;
  (in_RDI->super_AlexNode<int,_int>).is_leaf_ = false;
  (in_RDI->super_AlexNode<int,_int>).duplication_factor_ = '\0';
  (in_RDI->super_AlexNode<int,_int>).level_ = 0;
  *(undefined4 *)&(in_RDI->super_AlexNode<int,_int>).field_0xc = 0;
  Params::Params((Params *)&(in_RDI->super_AlexNode<int,_int>).model_);
  DerivedParams::DerivedParams((DerivedParams *)&(in_RDI->super_AlexNode<int,_int>).cost_);
  Stats::Stats((Stats *)&in_RDI->key_less_);
  ExperimentalParams::ExperimentalParams((ExperimentalParams *)&in_RDI->num_lookups_);
  InternalStats::InternalStats(in_stack_ffffffffffffffc0);
  comp = (AlexCompare *)((long)&in_RDI->expected_avg_exp_search_iterations_ + 5);
  std::allocator<std::pair<int,_int>_>::allocator((allocator<std::pair<int,_int>_> *)0x13941f);
  data_node_allocator(in_stack_ffffffffffffffb8);
  this_00 = __gnu_cxx::
            new_allocator<alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>_>
            ::allocate((new_allocator<alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>_>
                        *)in_RDI,(size_type)comp,in_stack_ffffffffffffffc0);
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
  AlexDataNode(in_RDI,comp,(allocator<std::pair<int,_int>_> *)this_00);
  std::
  allocator<alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>_>
  ::~allocator((allocator<alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>_>
                *)0x139476);
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::bulk_load
            (in_stack_00000020,in_stack_00000018,in_stack_00000014,in_stack_00000008,
             (bool)unaff_retaddr);
  (in_RDI->super_AlexNode<int,_int>)._vptr_AlexNode = (_func_int **)this_00;
  *(int *)&in_RDI->allocator_ = *(int *)&in_RDI->allocator_ + 1;
  create_superroot((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *)
                   this_00);
  return;
}

Assistant:

Alex() {
    // Set up root as empty data node
    auto empty_data_node = new (data_node_allocator().allocate(1))
        data_node_type(key_less_, allocator_);
    empty_data_node->bulk_load(nullptr, 0);
    root_node_ = empty_data_node;
    stats_.num_data_nodes++;
    create_superroot();
  }